

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int check_child(int ppri,AssocKind passoc,int cpri,AssocKind cassoc,int left,int right)

{
  int iVar1;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint r;
  uint c;
  uint p;
  int right_local;
  int left_local;
  AssocKind cassoc_local;
  int cpri_local;
  AssocKind passoc_local;
  int ppri_local;
  
  if (((cassoc & 4) == ASSOC_NONE) && ((passoc & 4) == ASSOC_NONE)) {
    if (((passoc & 0x10) == ASSOC_NONE) && ((passoc & 4) == ASSOC_NONE)) {
      local_34 = 3;
      if ((passoc & 1) != ASSOC_NONE) {
        local_34 = 2;
      }
    }
    else {
      local_34 = (uint)(right != 0);
    }
    if (((cassoc & 0x10) == ASSOC_NONE) && ((cassoc & 4) == ASSOC_NONE)) {
      local_38 = 2;
      if ((cassoc & 1) != ASSOC_NONE) {
        local_38 = 1;
      }
    }
    else {
      local_38 = 0;
    }
    if (ppri < cpri) {
      local_3c = 0;
    }
    else {
      if (cpri < ppri) {
        local_40 = 1;
      }
      else {
        iVar1 = 0;
        if ((cassoc & 2) != ASSOC_NONE) {
          iVar1 = 2;
        }
        local_40 = iVar1 + (uint)((passoc & 2) != ASSOC_NONE) + 2;
      }
      local_3c = local_40;
    }
    passoc_local = child_table[local_34][local_38][local_3c];
  }
  else {
    passoc_local = 1;
  }
  return passoc_local;
}

Assistant:

static int check_child(int ppri, AssocKind passoc, int cpri, AssocKind cassoc, int left, int right) {
  if (IS_NARY_ASSOC(cassoc) || IS_NARY_ASSOC(passoc)) return 1;
  uint p = IS_BINARY_NARY_ASSOC(passoc) ? (right ? 1 : 0) : (IS_LEFT_ASSOC(passoc) ? 2 : 3);
  uint c = IS_BINARY_NARY_ASSOC(cassoc) ? 0 : (IS_LEFT_ASSOC(cassoc) ? 1 : 2);
  uint r =
      cpri > ppri ? 0 : (cpri < ppri ? 1 : (2 + ((IS_RIGHT_ASSOC(cassoc) ? 2 : 0) + (IS_RIGHT_ASSOC(passoc) ? 1 : 0))));
  (void)left;
  return child_table[p][c][r];
}